

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_patch.h
# Opt level: O2

void __thiscall
embree::GeneralCatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::subdivide
          (GeneralCatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_16UL>
          *patch,uint *N_o)

{
  DynamicStackArray<float,_16UL,_64UL> *pDVar1;
  uint *puVar2;
  undefined8 *puVar3;
  vfloat_impl<4> *pvVar4;
  undefined8 *puVar5;
  int iVar6;
  GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *pGVar7;
  Face *pFVar8;
  GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *pGVar9;
  long *plVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL> *paVar17
  ;
  size_t i;
  vfloat_impl<4> *pvVar18;
  long lVar19;
  float *pfVar20;
  size_t k;
  ulong uVar21;
  vfloat_impl<4> **ppvVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *pDVar29;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *pDVar30;
  DynamicStackArray<float,_16UL,_64UL> *pDVar31;
  ulong uVar32;
  uint uVar33;
  uint i_3;
  CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *pCVar34;
  ulong uVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar43;
  float fVar44;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vfloat_impl<4> vVar42;
  float fVar45;
  undefined1 auVar46 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  ulong local_2e0;
  DynamicStackArray<float,_16UL,_64UL> *local_2d8;
  undefined8 uStack_2d0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  array_t<embree::vfloat_impl<4>,_32UL> center_ring;
  
  uVar26 = this->N;
  *N_o = uVar26;
  pDVar30 = &patch->items[0].ring.items[0].ring;
  pDVar31 = &patch->items[0].ring.items[0].crease_weight;
  uVar32 = 0;
  while( true ) {
    if (uVar26 <= uVar32) break;
    uVar35 = uVar32 + 1;
    pGVar7 = (this->ring).data;
    pGVar9 = pGVar7 + uVar32;
    pCVar34 = patch->items + uVar32;
    pDVar29 = &(pCVar34->ring).items[0].ring;
    (pCVar34->ring).items[0].edge_level = pGVar7[uVar32].edge_level * 0.5;
    (pCVar34->ring).items[0].vertex_level = pGVar7[uVar32].vertex_level * 0.5;
    uVar33 = pGVar7[uVar32].face_valence;
    (pCVar34->ring).items[0].face_valence = uVar33;
    (pCVar34->ring).items[0].edge_valence = uVar33 * 2;
    iVar6 = pGVar7[uVar32].border_face * 2;
    if (pGVar7[uVar32].border_face == -1) {
      iVar6 = -1;
    }
    (pCVar34->ring).items[0].border_index = iVar6;
    fVar36 = pGVar7[uVar32].vertex_crease_weight + -1.0;
    if (fVar36 <= 0.0) {
      fVar36 = 0.0;
    }
    (pCVar34->ring).items[0].vertex_crease_weight = fVar36;
    (pCVar34->ring).items[0].eval_start_index = pGVar7[uVar32].eval_start_face_index;
    (pCVar34->ring).items[0].eval_unique_identifier = pGVar7[uVar32].eval_unique_identifier;
    uVar24 = (ulong)pGVar7[uVar32].eval_start_vertex_index;
    fVar36 = 0.0;
    fVar48 = 0.0;
    fVar49 = 0.0;
    fVar50 = 0.0;
    for (uVar27 = 0; uVar23 = (ulong)pGVar9->face_valence, uVar27 < uVar23; uVar27 = uVar27 + 1) {
      uVar23 = (pGVar9->eval_start_face_index + uVar27) % uVar23;
      iVar6 = (pGVar9->faces).data[uVar23].size;
      auVar40 = *(undefined1 (*) [16])(pGVar9->vtx).field_0.v;
      for (uVar21 = uVar24; uVar21 <= (long)iVar6 + uVar24; uVar21 = uVar21 + 1) {
        pvVar18 = (pGVar9->ring).data + uVar21 % (ulong)pGVar9->edge_valence;
        auVar41._0_4_ = auVar40._0_4_ + (pvVar18->field_0).v[0];
        auVar41._4_4_ = auVar40._4_4_ + (pvVar18->field_0).v[1];
        auVar41._8_4_ = auVar40._8_4_ + (pvVar18->field_0).v[2];
        auVar41._12_4_ = auVar40._12_4_ + (pvVar18->field_0).v[3];
        auVar40 = auVar41;
      }
      pvVar18 = patch->items[uVar32].ring.items[0].ring.data;
      if ((0xf < uVar23) &&
         ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar18 == pDVar29)) {
        local_2d8 = pDVar31;
        pvVar18 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
        patch->items[uVar32].ring.items[0].ring.data = pvVar18;
        for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
          puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
          uVar13 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
          *puVar3 = *puVar5;
          puVar3[1] = uVar13;
        }
        pvVar18 = patch->items[uVar32].ring.items[0].ring.data;
      }
      fVar37 = (float)(iVar6 + 2);
      auVar11._4_4_ = fVar37;
      auVar11._0_4_ = fVar37;
      auVar11._8_4_ = fVar37;
      auVar11._12_4_ = fVar37;
      vVar42.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(auVar40,auVar11);
      pvVar18[uVar23 * 2 + 1].field_0 = vVar42.field_0;
      fVar36 = fVar36 + vVar42.field_0._0_4_;
      fVar48 = fVar48 + vVar42.field_0._4_4_;
      fVar49 = fVar49 + vVar42.field_0._8_4_;
      fVar50 = fVar50 + vVar42.field_0._12_4_;
      uVar24 = (uVar24 + (long)(pGVar9->faces).data[uVar23].size) % (ulong)pGVar9->edge_valence;
    }
    uVar24 = (ulong)pGVar9->eval_start_vertex_index;
    pDVar1 = &patch->items[uVar32].ring.items[0].crease_weight;
    local_2b8 = 0.0;
    fStack_2b4 = 0.0;
    fStack_2b0 = 0.0;
    fStack_2ac = 0.0;
    local_2e0 = 0;
    for (uVar27 = 0; uVar16 = center_ring.items[0].field_0._8_8_,
        uVar13 = center_ring.items[0].field_0._0_8_, uVar27 < uVar23; uVar27 = uVar27 + 1) {
      uVar23 = (pGVar9->eval_start_face_index + uVar27) % uVar23;
      pvVar18 = (pGVar9->ring).data + uVar24;
      fVar37 = (pGVar9->vtx).field_0.v[0] + (pvVar18->field_0).v[0];
      fVar51 = (pGVar9->vtx).field_0.v[1] + (pvVar18->field_0).v[1];
      fVar52 = (pGVar9->vtx).field_0.v[2] + (pvVar18->field_0).v[2];
      fVar53 = (pGVar9->vtx).field_0.v[3] + (pvVar18->field_0).v[3];
      uVar21 = uVar23 * 2 + 1;
      pvVar18 = patch->items[uVar32].ring.items[0].ring.data;
      if (uVar23 < 0x10) {
LAB_005c09e4:
        pvVar4 = pvVar18 + uVar21;
        fVar39 = (pvVar4->field_0).v[0];
        fVar43 = (pvVar4->field_0).v[1];
        fVar44 = (pvVar4->field_0).v[2];
        fVar45 = (pvVar4->field_0).v[3];
        if (uVar23 != 0) goto LAB_005c09f4;
        uVar33 = patch->items[uVar32].ring.items[0].edge_valence;
        if ((0x20 < uVar33) &&
           ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar18 == pDVar29)) {
          local_2d8 = pDVar31;
          pvVar18 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
          patch->items[uVar32].ring.items[0].ring.data = pvVar18;
          for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
            puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
            uVar13 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
            *puVar3 = *puVar5;
            puVar3[1] = uVar13;
          }
          pvVar18 = patch->items[uVar32].ring.items[0].ring.data;
        }
        pvVar18 = pvVar18 + (uVar33 - 1);
      }
      else {
        if ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar18 == pDVar29) {
          local_2d8 = pDVar31;
          pvVar18 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
          patch->items[uVar32].ring.items[0].ring.data = pvVar18;
          for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
            puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
            uVar13 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
            *puVar3 = *puVar5;
            puVar3[1] = uVar13;
          }
          pvVar18 = patch->items[uVar32].ring.items[0].ring.data;
          goto LAB_005c09e4;
        }
        pvVar4 = pvVar18 + uVar21;
        fVar39 = (pvVar4->field_0).v[0];
        fVar43 = (pvVar4->field_0).v[1];
        fVar44 = (pvVar4->field_0).v[2];
        fVar45 = (pvVar4->field_0).v[3];
LAB_005c09f4:
        if ((0x10 < uVar23) &&
           ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar18 == pDVar29)) {
          local_2d8 = pDVar31;
          pvVar18 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
          patch->items[uVar32].ring.items[0].ring.data = pvVar18;
          for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
            puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
            uVar13 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
            *puVar3 = *puVar5;
            puVar3[1] = uVar13;
          }
          pvVar18 = patch->items[uVar32].ring.items[0].ring.data;
        }
        pvVar18 = pvVar18 + uVar23 * 2 + -1;
      }
      fVar39 = fVar39 + (pvVar18->field_0).v[0];
      fVar43 = fVar43 + (pvVar18->field_0).v[1];
      fVar44 = fVar44 + (pvVar18->field_0).v[2];
      fVar45 = fVar45 + (pvVar18->field_0).v[3];
      pvVar18 = (pGVar9->ring).data + uVar24;
      fVar36 = fVar36 + (pvVar18->field_0).v[0];
      fVar48 = fVar48 + (pvVar18->field_0).v[1];
      fVar49 = fVar49 + (pvVar18->field_0).v[2];
      fVar50 = fVar50 + (pvVar18->field_0).v[3];
      local_2d8._0_4_ = (pGVar9->faces).data[uVar23].crease_weight + -1.0;
      auVar40 = _local_2d8;
      pfVar20 = patch->items[uVar32].ring.items[0].crease_weight.data;
      if ((0xf < uVar23) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar20 == pDVar1)) {
        pfVar20 = (float *)operator_new__(0x100);
        patch->items[uVar32].ring.items[0].crease_weight.data = pfVar20;
        for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
          patch->items[uVar32].ring.items[0].crease_weight.data[lVar19] = pDVar31->arr[lVar19];
        }
        pfVar20 = patch->items[uVar32].ring.items[0].crease_weight.data;
      }
      fVar38 = 0.0;
      if (0.0 <= local_2d8._0_4_) {
        fVar38 = local_2d8._0_4_;
      }
      pfVar20[uVar23] = fVar38;
      if (0.0 < (pGVar9->faces).data[uVar23].crease_weight) {
        pvVar18 = (pGVar9->ring).data + uVar24;
        local_2b8 = local_2b8 + (pvVar18->field_0).v[0];
        fStack_2b4 = fStack_2b4 + (pvVar18->field_0).v[1];
        fStack_2b0 = fStack_2b0 + (pvVar18->field_0).v[2];
        fStack_2ac = fStack_2ac + (pvVar18->field_0).v[3];
        *(ulong *)((long)&center_ring.items[0].field_0 + local_2e0 * 8) = uVar23;
        pvVar18 = patch->items[uVar32].ring.items[0].ring.data;
        if ((0x20 < uVar21) &&
           ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar18 == pDVar29)) {
          local_2d8 = pDVar31;
          pvVar18 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
          patch->items[uVar32].ring.items[0].ring.data = pvVar18;
          for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
            puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
            uVar13 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
            *puVar3 = *puVar5;
            puVar3[1] = uVar13;
          }
          pvVar18 = patch->items[uVar32].ring.items[0].ring.data;
          auVar40 = _local_2d8;
        }
        _local_2d8 = auVar40;
        local_2e0 = local_2e0 + 1;
        pvVar18 = pvVar18 + uVar23 * 2;
        (pvVar18->field_0).v[0] = fVar37 * 0.5;
        (pvVar18->field_0).v[1] = fVar51 * 0.5;
        (pvVar18->field_0).v[2] = fVar52 * 0.5;
        (pvVar18->field_0).v[3] = fVar53 * 0.5;
        fVar38 = (pGVar9->faces).data[uVar23].crease_weight;
        if (fVar38 < 1.0) {
          local_298 = (fVar37 + fVar39) * 0.25;
          fStack_294 = (fVar51 + fVar43) * 0.25;
          fStack_290 = (fVar52 + fVar44) * 0.25;
          fStack_28c = (fVar53 + fVar45) * 0.25;
          local_298 = (fVar37 * 0.5 - local_298) * fVar38 + local_298;
          fStack_294 = (fVar51 * 0.5 - fStack_294) * fVar38 + fStack_294;
          fStack_290 = (fVar52 * 0.5 - fStack_290) * fVar38 + fStack_290;
          fStack_28c = (fVar53 * 0.5 - fStack_28c) * fVar38 + fStack_28c;
          pvVar18 = patch->items[uVar32].ring.items[0].ring.data;
          auVar40 = _local_2d8;
          if (0x20 < uVar21) {
            local_2d8 = pDVar31;
            if ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar18 == pDVar29) {
              pvVar18 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
              patch->items[uVar32].ring.items[0].ring.data = pvVar18;
              for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
                puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
                uVar13 = puVar5[1];
                puVar3 = (undefined8 *)
                         ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
                *puVar3 = *puVar5;
                puVar3[1] = uVar13;
              }
              goto LAB_005c125f;
            }
            goto LAB_005c12c9;
          }
          goto LAB_005c0a9d;
        }
      }
      else {
        local_298 = (fVar37 + fVar39) * 0.25;
        fStack_294 = (fVar51 + fVar43) * 0.25;
        fStack_290 = (fVar52 + fVar44) * 0.25;
        fStack_28c = (fVar53 + fVar45) * 0.25;
        pvVar18 = patch->items[uVar32].ring.items[0].ring.data;
        if ((0x20 < uVar21) &&
           ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar18 == pDVar29)) {
          local_2d8 = pDVar31;
          pvVar18 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
          patch->items[uVar32].ring.items[0].ring.data = pvVar18;
          for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
            puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
            uVar13 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
            *puVar3 = *puVar5;
            puVar3[1] = uVar13;
          }
LAB_005c125f:
          pvVar18 = patch->items[uVar32].ring.items[0].ring.data;
          pDVar31 = local_2d8;
LAB_005c12c9:
          auVar40 = _local_2d8;
        }
LAB_005c0a9d:
        _local_2d8 = auVar40;
        pvVar18 = pvVar18 + uVar23 * 2;
        (pvVar18->field_0).v[0] = local_298;
        (pvVar18->field_0).v[1] = fStack_294;
        (pvVar18->field_0).v[2] = fStack_290;
        (pvVar18->field_0).v[3] = fStack_28c;
      }
      uVar24 = (uVar24 + (long)(pGVar9->faces).data[uVar23].size) % (ulong)pGVar9->edge_valence;
      uVar23 = (ulong)pGVar9->face_valence;
    }
    fVar51 = 1.0 / (float)uVar23;
    fVar37 = (float)uVar23 + -2.0;
    fVar52 = (fVar36 * fVar51 + fVar37 * (pGVar9->vtx).field_0.v[0]) * fVar51;
    fVar48 = (fVar48 * fVar51 + fVar37 * (pGVar9->vtx).field_0.v[1]) * fVar51;
    fVar49 = (fVar49 * fVar51 + fVar37 * (pGVar9->vtx).field_0.v[2]) * fVar51;
    fVar51 = (fVar50 * fVar51 + fVar37 * (pGVar9->vtx).field_0.v[3]) * fVar51;
    patch->items[uVar32].ring.items[0].vtx.field_0.v[0] = fVar52;
    patch->items[uVar32].ring.items[0].vtx.field_0.v[1] = fVar48;
    patch->items[uVar32].ring.items[0].vtx.field_0.v[2] = fVar49;
    patch->items[uVar32].ring.items[0].vtx.field_0.v[3] = fVar51;
    fVar36 = pGVar9->vertex_crease_weight;
    if (0.0 < fVar36) {
      if (1.0 <= fVar36) {
        fVar50 = (pGVar9->vtx).field_0.v[0];
        fVar37 = (pGVar9->vtx).field_0.v[1];
        fVar53 = (pGVar9->vtx).field_0.v[2];
        fVar39 = (pGVar9->vtx).field_0.v[3];
      }
      else {
        fVar50 = (pGVar9->vtx).field_0.v[0];
        fVar37 = (pGVar9->vtx).field_0.v[1];
        fVar53 = (pGVar9->vtx).field_0.v[2];
        fVar39 = (pGVar9->vtx).field_0.v[3];
        fVar50 = (fVar52 - fVar50) * fVar36 + fVar50;
        fVar37 = (fVar48 - fVar37) * fVar36 + fVar37;
        fVar53 = (fVar49 - fVar53) * fVar36 + fVar53;
        fVar39 = (fVar51 - fVar39) * fVar36 + fVar39;
      }
LAB_005c14db:
      patch->items[uVar32].ring.items[0].vtx.field_0.v[0] = fVar50;
      patch->items[uVar32].ring.items[0].vtx.field_0.v[1] = fVar37;
      patch->items[uVar32].ring.items[0].vtx.field_0.v[2] = fVar53;
      patch->items[uVar32].ring.items[0].vtx.field_0.v[3] = fVar39;
    }
    else if (1 < local_2e0) {
      fVar50 = (pGVar9->vtx).field_0.v[0];
      fVar37 = (pGVar9->vtx).field_0.v[1];
      fVar53 = (pGVar9->vtx).field_0.v[2];
      fVar39 = (pGVar9->vtx).field_0.v[3];
      if (local_2e0 == 2) {
        fVar50 = (local_2b8 + fVar50 * 6.0) * 0.125;
        fVar37 = (fStack_2b4 + fVar37 * 6.0) * 0.125;
        fVar53 = (fStack_2b0 + fVar53 * 6.0) * 0.125;
        fVar39 = (fStack_2ac + fVar39 * 6.0) * 0.125;
        pFVar8 = (pGVar9->faces).data;
        fVar36 = pFVar8[center_ring.items[0].field_0._0_8_].crease_weight;
        fVar43 = pFVar8[center_ring.items[0].field_0._8_8_].crease_weight;
        patch->items[uVar32].ring.items[0].vtx.field_0.v[0] = fVar50;
        patch->items[uVar32].ring.items[0].vtx.field_0.v[1] = fVar37;
        patch->items[uVar32].ring.items[0].vtx.field_0.v[2] = fVar53;
        patch->items[uVar32].ring.items[0].vtx.field_0.v[3] = fVar39;
        fVar44 = (fVar36 * 3.0 + fVar43) * 0.25 + -1.0;
        pfVar20 = patch->items[uVar32].ring.items[0].crease_weight.data;
        if ((0x10 < center_ring.items[0].field_0._0_8_ + 1) &&
           ((DynamicStackArray<float,_16UL,_64UL> *)pfVar20 == pDVar1)) {
          pfVar20 = (float *)operator_new__(0x100);
          patch->items[uVar32].ring.items[0].crease_weight.data = pfVar20;
          for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
            patch->items[uVar32].ring.items[0].crease_weight.data[lVar19] = pDVar31->arr[lVar19];
          }
          pfVar20 = patch->items[uVar32].ring.items[0].crease_weight.data;
        }
        fVar45 = 0.0;
        if (0.0 <= fVar44) {
          fVar45 = fVar44;
        }
        pfVar20[uVar13] = fVar45;
        local_2d8._0_4_ = (fVar43 * 3.0 + fVar36) * 0.25 + -1.0;
        pfVar20 = patch->items[uVar32].ring.items[0].crease_weight.data;
        if ((0x10 < uVar16 + 1) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar20 == pDVar1)) {
          pfVar20 = (float *)operator_new__(0x100);
          patch->items[uVar32].ring.items[0].crease_weight.data = pfVar20;
          for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
            patch->items[uVar32].ring.items[0].crease_weight.data[lVar19] = pDVar31->arr[lVar19];
          }
          pfVar20 = patch->items[uVar32].ring.items[0].crease_weight.data;
        }
        fVar44 = 0.0;
        if (0.0 <= local_2d8._0_4_) {
          fVar44 = local_2d8._0_4_;
        }
        pfVar20[uVar16] = fVar44;
        fVar36 = (fVar36 + fVar43) * 0.5;
        if (1.0 <= fVar36) goto LAB_005c1344;
        fVar50 = (fVar52 - fVar50) * fVar36 + fVar50;
        fVar37 = (fVar48 - fVar37) * fVar36 + fVar37;
        fVar53 = (fVar49 - fVar53) * fVar36 + fVar53;
        fVar39 = (fVar51 - fVar39) * fVar36 + fVar39;
      }
      goto LAB_005c14db;
    }
LAB_005c1344:
    patch->items[uVar32].ring.items[0].edge_level = (this->ring).data[uVar32].edge_level * 0.5;
    uVar24 = 0;
    if (uVar35 != uVar26) {
      uVar24 = uVar35 & 0xffffffff;
    }
    patch->items[uVar24].ring.items[3].edge_level = (this->ring).data[uVar32].edge_level * 0.5;
    uVar26 = this->N;
    pDVar30 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
              ((long)(pDVar30 + 5) + 0x1c0);
    pDVar31 = pDVar31 + 0x1a;
    uVar32 = uVar35;
  }
  ppvVar22 = &patch->items[0].ring.items[1].ring.data;
  uVar33 = 1;
  lVar19 = 0;
  uVar32 = 0;
  auVar40 = ZEXT816(0);
  fVar36 = 2.0;
  do {
    uVar35 = (ulong)uVar26;
    if (uVar35 <= uVar32) {
      fVar48 = (float)uVar35;
      auVar12._4_4_ = fVar48;
      auVar12._0_4_ = fVar48;
      auVar12._8_4_ = fVar48;
      auVar12._12_4_ = fVar48;
      aVar47 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(auVar40,auVar12);
      pDVar30 = &patch->items[0].ring.items[2].ring;
      pDVar31 = &patch->items[0].ring.items[2].crease_weight;
      for (uVar32 = 0; uVar32 < uVar26; uVar32 = uVar32 + 1) {
        patch->items[uVar32].ring.items[2].vertex_level = fVar36;
        patch->items[uVar32].ring.items[2].face_valence = uVar26;
        uVar33 = uVar26 * 2;
        patch->items[uVar32].ring.items[2].edge_valence = uVar33;
        patch->items[uVar32].ring.items[2].border_index = -1;
        patch->items[uVar32].ring.items[2].vtx.field_0 = aVar47;
        patch->items[uVar32].ring.items[2].vertex_crease_weight = 0.0;
        for (uVar35 = 0; uVar35 != uVar33; uVar35 = uVar35 + 1) {
          uVar24 = (ulong)(uVar33 + (int)uVar32 * 2 + -1 + (int)uVar35) % (ulong)uVar33;
          fVar48 = center_ring.items[uVar24].field_0.v[0];
          fVar49 = center_ring.items[uVar24].field_0.v[1];
          fVar50 = center_ring.items[uVar24].field_0.v[2];
          fVar37 = center_ring.items[uVar24].field_0.v[3];
          pvVar18 = patch->items[uVar32].ring.items[2].ring.data;
          if ((0x1f < uVar35) &&
             ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar18 ==
              &patch->items[uVar32].ring.items[2].ring)) {
            pvVar18 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
            patch->items[uVar32].ring.items[2].ring.data = pvVar18;
            for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
              puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
              uVar13 = puVar5[1];
              puVar3 = (undefined8 *)
                       ((long)&(patch->items[uVar32].ring.items[2].ring.data)->field_0 + lVar19);
              *puVar3 = *puVar5;
              puVar3[1] = uVar13;
            }
            pvVar18 = patch->items[uVar32].ring.items[2].ring.data;
          }
          pvVar18 = pvVar18 + uVar35;
          (pvVar18->field_0).v[0] = fVar48;
          (pvVar18->field_0).v[1] = fVar49;
          (pvVar18->field_0).v[2] = fVar50;
          (pvVar18->field_0).v[3] = fVar37;
        }
        for (uVar35 = 0; uVar35 != uVar26; uVar35 = uVar35 + 1) {
          pfVar20 = patch->items[uVar32].ring.items[2].crease_weight.data;
          if ((0xf < uVar35) &&
             ((DynamicStackArray<float,_16UL,_64UL> *)pfVar20 ==
              &patch->items[uVar32].ring.items[2].crease_weight)) {
            pfVar20 = (float *)operator_new__(0x100);
            patch->items[uVar32].ring.items[2].crease_weight.data = pfVar20;
            for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
              patch->items[uVar32].ring.items[2].crease_weight.data[lVar19] = pDVar31->arr[lVar19];
            }
            pfVar20 = patch->items[uVar32].ring.items[2].crease_weight.data;
          }
          pfVar20[uVar35] = 0.0;
        }
        uVar26 = uVar33 + (int)uVar32 * -2 >> 1;
        patch->items[uVar32].ring.items[2].eval_start_index = uVar26;
        puVar2 = &patch->items[uVar32].ring.items[2].face_valence;
        if (*puVar2 <= uVar26) {
          patch->items[uVar32].ring.items[2].eval_start_index = uVar26 - *puVar2;
        }
        patch->items[uVar32].ring.items[2].eval_unique_identifier = 0;
        uVar26 = this->N;
        pDVar30 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                  ((long)(pDVar30 + 5) + 0x1c0);
        pDVar31 = pDVar31 + 0x1a;
      }
      return;
    }
    uVar27 = uVar32 + 1;
    pGVar9 = (this->ring).data;
    uVar24 = 0;
    if (uVar27 != uVar35) {
      uVar24 = uVar27 & 0xffffffff;
    }
    if ((*(int *)((long)&pGVar9->border_face + lVar19) ==
         *(int *)((long)&pGVar9->face_valence + lVar19) + -1) || (pGVar9[uVar24].face_valence < 3))
    {
      *(float *)(ppvVar22 + -0x48) = *(float *)((long)ppvVar22 + -0x57c);
      patch->items[uVar24].ring.items[3].vertex_level = *(float *)((long)ppvVar22 + -0x57c);
      *(undefined4 *)((long)ppvVar22 + -0x2fc) = 3;
      patch->items[uVar24].ring.items[3].face_valence = 3;
      *(undefined4 *)(ppvVar22 + -0x5f) = 6;
      patch->items[uVar24].ring.items[3].edge_valence = 6;
      *(undefined4 *)(ppvVar22 + -0x60) = 2;
      patch->items[uVar24].ring.items[3].border_index = 4;
      plVar10 = (long *)ppvVar22[-0x68];
      lVar14 = *plVar10;
      lVar15 = plVar10[1];
      ppvVar22[-0x46] = (vfloat_impl<4> *)lVar14;
      ppvVar22[-0x45] = (vfloat_impl<4> *)lVar15;
      paVar17 = &patch->items[uVar24].ring;
      *(long *)&paVar17->items[3].vtx.field_0 = lVar14;
      *(long *)((long)&paVar17->items[3].vtx.field_0 + 8) = lVar15;
      *(undefined4 *)((long)ppvVar22 + -0x2f4) = 0;
      patch->items[uVar24].ring.items[3].vertex_crease_weight = 0.0;
      lVar14 = plVar10[2];
      lVar15 = plVar10[3];
      pvVar18 = *ppvVar22;
      *(long *)&pvVar18->field_0 = lVar14;
      *(long *)((long)&pvVar18->field_0 + 8) = lVar15;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(long *)&pvVar18[2].field_0 = lVar14;
      *(long *)((long)&pvVar18[2].field_0 + 8) = lVar15;
      pvVar18 = patch->items[uVar24].ring.items[0].ring.data;
      uVar13 = *(undefined8 *)&pvVar18->field_0;
      uVar16 = *(undefined8 *)((long)&pvVar18->field_0 + 8);
      pvVar18 = *ppvVar22;
      *(undefined8 *)&pvVar18[5].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[5].field_0 + 8) = uVar16;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pvVar18[1].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[1].field_0 + 8) = uVar16;
      paVar17 = &patch->items[uVar24].ring;
      uVar13 = *(undefined8 *)&paVar17->items[0].vtx.field_0;
      uVar16 = *(undefined8 *)((long)&paVar17->items[0].vtx.field_0 + 8);
      pvVar18 = *ppvVar22;
      *(undefined8 *)&pvVar18[4].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[4].field_0 + 8) = uVar16;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pvVar18->field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18->field_0 + 8) = uVar16;
      puVar5 = (undefined8 *)((long)ppvVar22[-0x68] + 0x10 + (long)(int)ppvVar22[-200] * 0x10);
      uVar13 = *puVar5;
      uVar16 = puVar5[1];
      pvVar18 = *ppvVar22;
      *(undefined8 *)&pvVar18[3].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[3].field_0 + 8) = uVar16;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pvVar18[5].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[5].field_0 + 8) = uVar16;
      lVar14 = (long)ppvVar22[-0xae];
      lVar15 = (long)ppvVar22[-0xad];
      pvVar18 = *ppvVar22;
      *(long *)&pvVar18[2].field_0 = lVar14;
      *(long *)((long)&pvVar18[2].field_0 + 8) = lVar15;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(long *)&pvVar18[4].field_0 = lVar14;
      *(long *)((long)&pvVar18[4].field_0 + 8) = lVar15;
      uVar13 = *(undefined8 *)((long)ppvVar22[-0x68] + 0x20);
      uVar16 = *(undefined8 *)((long)ppvVar22[-0x68] + 0x28);
      pvVar18 = *ppvVar22;
      *(undefined8 *)&pvVar18[1].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[1].field_0 + 8) = uVar16;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pvVar18[3].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[3].field_0 + 8) = uVar16;
      *(undefined4 *)ppvVar22[-0x50] = 0;
      patch->items[uVar24].ring.items[3].crease_weight.data[1] = 0.0;
      pCVar34 = patch->items + uVar24;
      fVar48 = patch->items[uVar24].ring.items[0].crease_weight.data[1];
      *(float *)((long)ppvVar22[-0x50] + 8) = fVar48;
      *patch->items[uVar24].ring.items[3].crease_weight.data = fVar48;
      fVar48 = *(float *)ppvVar22[-0xb8];
      *(float *)((long)ppvVar22[-0x50] + 4) = fVar48;
      patch->items[uVar24].ring.items[3].crease_weight.data[2] = fVar48;
      uVar28 = *(uint *)((long)ppvVar22 + -0x574);
      uVar25 = patch->items[uVar24].ring.items[0].eval_unique_identifier;
      if (uVar28 <= uVar25) {
        *(undefined4 *)(ppvVar22 + -0x47) = 1;
        (pCVar34->ring).items[3].eval_start_index = 2;
        goto LAB_005c1baf;
      }
      *(undefined4 *)(ppvVar22 + -0x47) = 2;
      (pCVar34->ring).items[3].eval_start_index = 0;
LAB_005c1b77:
      *(uint *)((long)ppvVar22 + -0x234) = uVar25;
      (pCVar34->ring).items[3].eval_unique_identifier = uVar25;
    }
    else {
      *(float *)(ppvVar22 + -0x48) = *(float *)((long)ppvVar22 + -0x57c);
      patch->items[uVar24].ring.items[3].vertex_level = *(float *)((long)ppvVar22 + -0x57c);
      *(undefined4 *)((long)ppvVar22 + -0x2fc) = 4;
      patch->items[uVar24].ring.items[3].face_valence = 4;
      *(undefined4 *)(ppvVar22 + -0x5f) = 8;
      patch->items[uVar24].ring.items[3].edge_valence = 8;
      *(undefined4 *)(ppvVar22 + -0x60) = 0xffffffff;
      patch->items[uVar24].ring.items[3].border_index = -1;
      plVar10 = (long *)ppvVar22[-0x68];
      lVar14 = *plVar10;
      lVar15 = plVar10[1];
      ppvVar22[-0x46] = (vfloat_impl<4> *)lVar14;
      ppvVar22[-0x45] = (vfloat_impl<4> *)lVar15;
      paVar17 = &patch->items[uVar24].ring;
      *(long *)&paVar17->items[3].vtx.field_0 = lVar14;
      *(long *)((long)&paVar17->items[3].vtx.field_0 + 8) = lVar15;
      *(undefined4 *)((long)ppvVar22 + -0x2f4) = 0;
      patch->items[uVar24].ring.items[3].vertex_crease_weight = 0.0;
      lVar14 = plVar10[2];
      lVar15 = plVar10[3];
      pvVar18 = *ppvVar22;
      *(long *)&pvVar18->field_0 = lVar14;
      *(long *)((long)&pvVar18->field_0 + 8) = lVar15;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(long *)&pvVar18[2].field_0 = lVar14;
      *(long *)((long)&pvVar18[2].field_0 + 8) = lVar15;
      pvVar18 = patch->items[uVar24].ring.items[0].ring.data;
      uVar13 = *(undefined8 *)&pvVar18->field_0;
      uVar16 = *(undefined8 *)((long)&pvVar18->field_0 + 8);
      pvVar18 = *ppvVar22;
      *(undefined8 *)&pvVar18[7].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[7].field_0 + 8) = uVar16;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pvVar18[1].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[1].field_0 + 8) = uVar16;
      paVar17 = &patch->items[uVar24].ring;
      uVar13 = *(undefined8 *)&paVar17->items[0].vtx.field_0;
      uVar16 = *(undefined8 *)((long)&paVar17->items[0].vtx.field_0 + 8);
      pvVar18 = *ppvVar22;
      *(undefined8 *)&pvVar18[6].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[6].field_0 + 8) = uVar16;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pvVar18->field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18->field_0 + 8) = uVar16;
      pvVar18 = patch->items[uVar24].ring.items[0].ring.data;
      uVar13 = *(undefined8 *)&pvVar18[4].field_0;
      uVar16 = *(undefined8 *)((long)&pvVar18[4].field_0 + 8);
      pvVar18 = *ppvVar22;
      *(undefined8 *)&pvVar18[5].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[5].field_0 + 8) = uVar16;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pvVar18[7].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[7].field_0 + 8) = uVar16;
      puVar5 = (undefined8 *)((long)ppvVar22[-0x68] + (ulong)((int)ppvVar22[-199] - 1) * 0x10);
      uVar13 = *puVar5;
      uVar16 = puVar5[1];
      pvVar18 = *ppvVar22;
      *(undefined8 *)&pvVar18[4].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[4].field_0 + 8) = uVar16;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pvVar18[6].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[6].field_0 + 8) = uVar16;
      puVar5 = (undefined8 *)((long)ppvVar22[-0x68] + (ulong)((int)ppvVar22[-199] - 2) * 0x10);
      uVar13 = *puVar5;
      uVar16 = puVar5[1];
      pvVar18 = *ppvVar22;
      *(undefined8 *)&pvVar18[3].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[3].field_0 + 8) = uVar16;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pvVar18[5].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[5].field_0 + 8) = uVar16;
      lVar14 = (long)ppvVar22[-0xae];
      lVar15 = (long)ppvVar22[-0xad];
      pvVar18 = *ppvVar22;
      *(long *)&pvVar18[2].field_0 = lVar14;
      *(long *)((long)&pvVar18[2].field_0 + 8) = lVar15;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(long *)&pvVar18[4].field_0 = lVar14;
      *(long *)((long)&pvVar18[4].field_0 + 8) = lVar15;
      uVar13 = *(undefined8 *)((long)ppvVar22[-0x68] + 0x20);
      uVar16 = *(undefined8 *)((long)ppvVar22[-0x68] + 0x28);
      pvVar18 = *ppvVar22;
      *(undefined8 *)&pvVar18[1].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[1].field_0 + 8) = uVar16;
      pvVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pvVar18[3].field_0 = uVar13;
      *(undefined8 *)((long)&pvVar18[3].field_0 + 8) = uVar16;
      *(undefined4 *)ppvVar22[-0x50] = 0;
      patch->items[uVar24].ring.items[3].crease_weight.data[1] = 0.0;
      pCVar34 = patch->items + uVar24;
      fVar48 = patch->items[uVar24].ring.items[0].crease_weight.data[1];
      *(float *)((long)ppvVar22[-0x50] + 0xc) = fVar48;
      *patch->items[uVar24].ring.items[3].crease_weight.data = fVar48;
      *(undefined4 *)((long)ppvVar22[-0x50] + 8) = 0;
      patch->items[uVar24].ring.items[3].crease_weight.data[3] = 0.0;
      fVar48 = *(float *)ppvVar22[-0xb8];
      *(float *)((long)ppvVar22[-0x50] + 4) = fVar48;
      patch->items[uVar24].ring.items[3].crease_weight.data[2] = fVar48;
      uVar28 = *(uint *)((long)ppvVar22 + -0x574);
      uVar25 = patch->items[uVar24].ring.items[0].eval_unique_identifier;
      if (uVar25 < uVar28) {
        *(undefined4 *)(ppvVar22 + -0x47) = 1;
        (pCVar34->ring).items[3].eval_start_index = 2;
        goto LAB_005c1b77;
      }
      *(undefined4 *)(ppvVar22 + -0x47) = 3;
      (pCVar34->ring).items[3].eval_start_index = 0;
LAB_005c1baf:
      *(uint *)((long)ppvVar22 + -0x234) = uVar28;
      (pCVar34->ring).items[3].eval_unique_identifier = uVar28;
    }
    pGVar9 = (this->ring).data;
    fVar48 = (pGVar9[(ulong)(((int)uVar32 + uVar26) - 1) % (ulong)uVar26].edge_level +
             pGVar9[uVar24].edge_level) * 0.25;
    patch->items[uVar24].ring.items[2].edge_level = fVar48;
    *(float *)((long)ppvVar22 + -0x23c) = fVar48;
    if (fVar48 <= fVar36) {
      fVar48 = fVar36;
    }
    pfVar20 = (float *)((long)((((this->ring).data)->ring).arr + -4) + lVar19);
    auVar46._0_4_ = auVar40._0_4_ + *pfVar20;
    auVar46._4_4_ = auVar40._4_4_ + pfVar20[1];
    auVar46._8_4_ = auVar40._8_4_ + pfVar20[2];
    auVar46._12_4_ = auVar40._12_4_ + pfVar20[3];
    lVar14 = (long)ppvVar22[-0xad];
    *(vfloat_impl<4> **)&center_ring.items[uVar33 - 1].field_0 = ppvVar22[-0xae];
    *(long *)((long)&center_ring.items[uVar33 - 1].field_0 + 8) = lVar14;
    uVar13 = *(undefined8 *)((long)ppvVar22[-0x68] + 8);
    *(undefined8 *)&center_ring.items[uVar33].field_0 = *(undefined8 *)ppvVar22[-0x68];
    *(undefined8 *)((long)&center_ring.items[uVar33].field_0 + 8) = uVar13;
    uVar26 = this->N;
    uVar33 = uVar33 + 2;
    lVar19 = lVar19 + 0x380;
    ppvVar22 = ppvVar22 + 0x1a0;
    uVar32 = uVar27;
    auVar40 = auVar46;
    fVar36 = fVar48;
  } while( true );
}

Assistant:

__noinline void subdivide(array_t<CatmullClarkPatch,SIZE>& patch, unsigned& N_o) const
    {
      N_o = N;
      assert( N );
      for (unsigned i=0; i<N; i++) {
        unsigned ip1 = (i+1)%N; // FIXME: %
        ring[i].subdivide(patch[i].ring[0]);
        patch[i]  .ring[0].edge_level = 0.5f*ring[i].edge_level;
        patch[ip1].ring[3].edge_level = 0.5f*ring[i].edge_level;
        
	assert( patch[i].ring[0].hasValidPositions() );
        
      }
      assert(N < 2*SIZE);
      Vertex_t center = Vertex_t(0.0f);
      array_t<Vertex_t,2*SIZE> center_ring;
      float center_vertex_level = 2.0f; // guarantees that irregular vertices get always isolated also for non-quads
      
      for (unsigned i=0; i<N; i++)
      {
        unsigned ip1 = (i+1)%N; // FIXME: %
        unsigned im1 = (i+N-1)%N; // FIXME: %
        bool regular = ring[i].has_last_face() && ring[ip1].face_valence > 2;
        if (likely(regular)) init_regular(patch[i].ring[0],patch[ip1].ring[0],patch[i].ring[1],patch[ip1].ring[3]); 
        else                 init_border (patch[i].ring[0],patch[ip1].ring[0],patch[i].ring[1],patch[ip1].ring[3]);
        
	assert( patch[i].ring[1].hasValidPositions() );
	assert( patch[ip1].ring[3].hasValidPositions() );
        
	float level = 0.25f*(ring[im1].edge_level+ring[ip1].edge_level);
        patch[i].ring[1].edge_level = patch[ip1].ring[2].edge_level = level;
	center_vertex_level = max(center_vertex_level,level);
        
        center += ring[i].vtx;
        center_ring[2*i+0] = (Vertex_t)patch[i].ring[0].vtx;
        center_ring[2*i+1] = (Vertex_t)patch[i].ring[0].ring[0];
      }
      center /= float(N);
      
      for (unsigned int i=0; i<N; i++) {
        init_regular(center,center_ring,center_vertex_level,N,2*i,patch[i].ring[2]);
        
	assert( patch[i].ring[2].hasValidPositions() );
      }
    }